

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_2_4_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  float *data;
  ulong uVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  float *pfVar37;
  long lVar38;
  float *pfVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  int k_count;
  long lVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  float *pfVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  undefined1 auVar86 [16];
  float fVar87;
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  int data_width;
  
  auVar60._8_4_ = 0x80000000;
  auVar60._0_8_ = 0x8000000080000000;
  auVar60._12_4_ = 0x80000000;
  auVar61._8_4_ = 0x3effffff;
  auVar61._0_8_ = 0x3effffff3effffff;
  auVar61._12_4_ = 0x3effffff;
  fVar67 = ipoint->scale;
  auVar92 = ZEXT464((uint)fVar67);
  auVar53 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)fVar67),auVar60,0xf8);
  auVar53 = ZEXT416((uint)(fVar67 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  iVar15 = (int)auVar53._0_4_;
  fVar66 = -0.08 / (fVar67 * fVar67);
  auVar54 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)ipoint->x),auVar60,0xf8);
  auVar54 = ZEXT416((uint)(ipoint->x + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55._0_8_ = (double)auVar54._0_4_;
  auVar55._8_8_ = auVar54._8_8_;
  auVar59._0_8_ = (double)fVar67;
  auVar59._8_8_ = 0;
  auVar54 = vfmadd231sd_fma(auVar55,auVar59,ZEXT816(0x3fe0000000000000));
  auVar58._0_4_ = (float)auVar54._0_8_;
  auVar58._4_12_ = auVar54._4_12_;
  auVar54 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)ipoint->y),auVar60,0xf8);
  auVar54 = ZEXT416((uint)(ipoint->y + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar56._0_8_ = (double)auVar54._0_4_;
  auVar56._8_8_ = auVar54._8_8_;
  auVar54 = vfmadd231sd_fma(auVar56,auVar59,ZEXT816(0x3fe0000000000000));
  auVar57._0_4_ = (float)auVar54._0_8_;
  auVar57._4_12_ = auVar54._4_12_;
  auVar54._0_4_ = (int)auVar53._0_4_;
  auVar54._4_4_ = (int)auVar53._4_4_;
  auVar54._8_4_ = (int)auVar53._8_4_;
  auVar54._12_4_ = (int)auVar53._12_4_;
  auVar53 = vcvtdq2ps_avx(auVar54);
  fVar3 = auVar58._0_4_ - auVar53._0_4_;
  fVar4 = auVar57._0_4_ - auVar53._0_4_;
  auVar53 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar67),auVar58);
  auVar54 = vpternlogd_avx512vl(auVar61,auVar53,auVar60,0xf8);
  auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar54._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = ZEXT416((uint)fVar67);
  if (iVar15 < (int)auVar53._0_4_) {
    auVar53 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar54,auVar57);
    auVar62._8_4_ = 0x3effffff;
    auVar62._0_8_ = 0x3effffff3effffff;
    auVar62._12_4_ = 0x3effffff;
    auVar63._8_4_ = 0x80000000;
    auVar63._0_8_ = 0x8000000080000000;
    auVar63._12_4_ = 0x80000000;
    auVar55 = vpternlogd_avx512vl(auVar63,auVar53,auVar62,0xea);
    auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar55._0_4_));
    auVar53 = vroundss_avx(auVar53,auVar53,0xb);
    if (iVar15 < (int)auVar53._0_4_) {
      auVar53 = vfmadd231ss_fma(auVar58,auVar54,ZEXT416(0x41300000));
      auVar64._8_4_ = 0x80000000;
      auVar64._0_8_ = 0x8000000080000000;
      auVar64._12_4_ = 0x80000000;
      auVar55 = vpternlogd_avx512vl(auVar64,auVar53,auVar62,0xea);
      auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar55._0_4_));
      auVar53 = vroundss_avx(auVar53,auVar53,0xb);
      if ((int)auVar53._0_4_ + iVar15 <= iimage->width) {
        auVar53 = vfmadd231ss_fma(auVar57,auVar54,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar55 = vpternlogd_avx512vl(auVar62,auVar53,auVar13,0xf8);
        auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar55._0_4_));
        auVar53 = vroundss_avx(auVar53,auVar53,0xb);
        if ((int)auVar53._0_4_ + iVar15 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          pfVar39 = iimage->data;
          iVar1 = iimage->data_width;
          iVar32 = iVar15 * 2;
          pfVar37 = haarResponseY + 0x1b;
          pfVar52 = haarResponseX + 0x1b;
          uVar21 = 0xfffffff4;
          do {
            auVar53._0_4_ = (float)(int)uVar21;
            auVar89 = in_ZMM8._4_12_;
            auVar53._4_12_ = auVar89;
            auVar53 = vfmadd213ss_fma(auVar53,auVar54,ZEXT416((uint)(fVar4 + 0.5)));
            iVar16 = (int)auVar53._0_4_;
            auVar79._0_4_ = (float)(int)(uVar21 | 1);
            auVar79._4_12_ = auVar89;
            auVar53 = vfmadd213ss_fma(auVar79,auVar54,ZEXT416((uint)(fVar4 + 0.5)));
            iVar26 = (int)auVar53._0_4_;
            iVar24 = (iVar16 + -1) * iVar1;
            iVar25 = (iVar16 + -1 + iVar15) * iVar1;
            iVar27 = (iVar16 + -1 + iVar32) * iVar1;
            iVar28 = (iVar26 + -1) * iVar1;
            iVar16 = (iVar26 + -1 + iVar15) * iVar1;
            iVar26 = (iVar26 + -1 + iVar32) * iVar1;
            lVar47 = 0;
            do {
              iVar29 = (int)lVar47;
              auVar80._0_4_ = (float)(iVar29 + -0xc);
              auVar80._4_12_ = auVar89;
              auVar53 = vfmadd213ss_fma(auVar80,auVar54,ZEXT416((uint)fVar3));
              iVar17 = (int)auVar53._0_4_;
              auVar81._0_4_ = (float)(iVar29 + -0xb);
              auVar88 = auVar61._4_12_;
              auVar81._4_12_ = auVar88;
              auVar53 = vfmadd213ss_fma(auVar81,auVar54,ZEXT416((uint)fVar3));
              iVar43 = (int)auVar53._0_4_;
              auVar82._0_4_ = (float)(iVar29 + -10);
              auVar82._4_12_ = auVar88;
              auVar53 = vfmadd213ss_fma(auVar82,auVar54,ZEXT416((uint)fVar3));
              iVar49 = (int)auVar53._0_4_;
              auVar83._0_4_ = (float)(iVar29 + -9);
              auVar83._4_12_ = auVar88;
              auVar53 = vfmadd213ss_fma(auVar83,auVar54,ZEXT416((uint)fVar3));
              iVar30 = (int)auVar53._0_4_;
              iVar20 = iVar17 + -1 + iVar15;
              iVar19 = iVar17 + -1 + iVar32;
              fVar67 = pfVar39[iVar25 + -1 + iVar17];
              fVar72 = pfVar39[iVar27 + -1 + iVar17];
              fVar76 = pfVar39[iVar27 + iVar19];
              fVar85 = pfVar39[iVar24 + -1 + iVar17];
              fVar5 = pfVar39[iVar24 + iVar19];
              auVar55 = SUB6416(ZEXT464(0x40000000),0);
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar24 + iVar20] -
                                                      pfVar39[iVar27 + iVar20])),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              fVar73 = pfVar39[iVar25 + iVar19];
              pfVar52[lVar47 + -0x1b] = (fVar72 - fVar5) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              iVar50 = iVar43 + -1 + iVar15;
              iVar44 = iVar43 + -1 + iVar32;
              pfVar37[lVar47 + -0x1b] = auVar53._0_4_ - (fVar72 - fVar5);
              fVar67 = pfVar39[iVar25 + -1 + iVar43];
              fVar72 = pfVar39[iVar27 + -1 + iVar43];
              fVar76 = pfVar39[iVar27 + iVar44];
              fVar85 = pfVar39[iVar24 + -1 + iVar43];
              fVar5 = pfVar39[iVar24 + iVar44];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar24 + iVar50] -
                                                      pfVar39[iVar27 + iVar50])),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              fVar73 = pfVar39[iVar25 + iVar44];
              pfVar52[lVar47 + -0x1a] = (fVar72 - fVar5) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              pfVar37[lVar47 + -0x1a] = auVar53._0_4_ - (fVar72 - fVar5);
              iVar35 = iVar49 + -1 + iVar15;
              iVar42 = iVar49 + -1 + iVar32;
              fVar67 = pfVar39[iVar25 + -1 + iVar49];
              fVar72 = pfVar39[iVar27 + -1 + iVar49];
              fVar76 = pfVar39[iVar27 + iVar42];
              fVar85 = pfVar39[iVar24 + -1 + iVar49];
              fVar5 = pfVar39[iVar24 + iVar42];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar24 + iVar35] -
                                                      pfVar39[iVar27 + iVar35])),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              fVar73 = pfVar39[iVar25 + iVar42];
              pfVar52[lVar47 + -0x19] = (fVar72 - fVar5) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              iVar18 = iVar30 + -1 + iVar15;
              iVar51 = iVar30 + -1 + iVar32;
              pfVar37[lVar47 + -0x19] = auVar53._0_4_ - (fVar72 - fVar5);
              fVar67 = pfVar39[iVar25 + -1 + iVar30];
              fVar72 = pfVar39[iVar27 + -1 + iVar30];
              fVar76 = pfVar39[iVar27 + iVar51];
              fVar85 = pfVar39[iVar24 + -1 + iVar30];
              fVar5 = pfVar39[iVar24 + iVar51];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar24 + iVar18] -
                                                      pfVar39[iVar27 + iVar18])),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              fVar73 = pfVar39[iVar25 + iVar51];
              pfVar52[lVar47 + -0x18] = (fVar72 - fVar5) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              pfVar37[lVar47 + -0x18] = auVar53._0_4_ - (fVar72 - fVar5);
              fVar67 = pfVar39[iVar16 + -1 + iVar17];
              fVar72 = pfVar39[iVar26 + -1 + iVar17];
              fVar76 = pfVar39[iVar19 + iVar26];
              fVar85 = pfVar39[iVar28 + -1 + iVar17];
              fVar5 = pfVar39[iVar28 + iVar19];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar28 + iVar20] -
                                                      pfVar39[iVar20 + iVar26])),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              fVar73 = pfVar39[iVar16 + iVar19];
              pfVar52[lVar47 + -3] = (fVar72 - fVar5) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              pfVar37[lVar47 + -3] = auVar53._0_4_ - (fVar72 - fVar5);
              fVar67 = pfVar39[iVar16 + -1 + iVar43];
              fVar72 = pfVar39[iVar26 + -1 + iVar43];
              fVar76 = pfVar39[iVar44 + iVar26];
              fVar85 = pfVar39[iVar28 + -1 + iVar43];
              fVar5 = pfVar39[iVar28 + iVar44];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar28 + iVar50] -
                                                      pfVar39[iVar50 + iVar26])),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              fVar73 = pfVar39[iVar16 + iVar44];
              pfVar52[lVar47 + -2] = (fVar72 - fVar5) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              pfVar37[lVar47 + -2] = auVar53._0_4_ - (fVar72 - fVar5);
              fVar67 = pfVar39[iVar16 + -1 + iVar49];
              fVar72 = pfVar39[iVar26 + -1 + iVar49];
              fVar76 = pfVar39[iVar42 + iVar26];
              fVar85 = pfVar39[iVar28 + -1 + iVar49];
              fVar5 = pfVar39[iVar28 + iVar42];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar28 + iVar35] -
                                                      pfVar39[iVar35 + iVar26])),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              fVar73 = pfVar39[iVar16 + iVar42];
              pfVar52[lVar47 + -1] = (fVar72 - fVar5) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              pfVar37[lVar47 + -1] = auVar53._0_4_ - (fVar72 - fVar5);
              fVar67 = pfVar39[iVar16 + -1 + iVar30];
              fVar72 = pfVar39[iVar26 + -1 + iVar30];
              fVar76 = pfVar39[iVar51 + iVar26];
              fVar85 = pfVar39[iVar28 + -1 + iVar30];
              fVar5 = pfVar39[iVar28 + iVar51];
              fVar73 = pfVar39[iVar16 + iVar51];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar28 + iVar18] -
                                                      pfVar39[iVar18 + iVar26])),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              pfVar52[lVar47] = (fVar72 - fVar5) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),auVar55,
                                        ZEXT416((uint)(fVar76 - fVar85)));
              pfVar37[lVar47] = auVar53._0_4_ - (fVar72 - fVar5);
              lVar47 = lVar47 + 4;
            } while (iVar29 + -0xc < 8);
            pfVar37 = pfVar37 + 0x30;
            pfVar52 = pfVar52 + 0x30;
            bVar2 = (int)uVar21 < 10;
            uVar21 = uVar21 + 2;
          } while (bVar2);
          goto LAB_001c04a0;
        }
      }
    }
  }
  iVar1 = iVar15 * 2;
  lVar47 = 0;
  uVar21 = 0xfffffff4;
  do {
    auVar68._0_4_ = (float)(int)uVar21;
    auVar68._4_12_ = in_ZMM8._4_12_;
    auVar53 = vfmadd213ss_fma(auVar68,auVar92._0_16_,ZEXT416((uint)fVar4));
    auVar70._0_4_ = (float)(int)(uVar21 | 1);
    auVar70._4_12_ = in_ZMM8._4_12_;
    auVar55 = vfmadd213ss_fma(auVar70,auVar92._0_16_,ZEXT416((uint)fVar4));
    fVar67 = auVar53._0_4_;
    iVar49 = (int)((double)((ulong)(0.0 <= fVar67) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar67) * -0x4020000000000000) + (double)fVar67);
    fVar67 = auVar55._0_4_;
    iVar16 = (int)((double)((ulong)(0.0 <= fVar67) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar67) * -0x4020000000000000) + (double)fVar67);
    iVar24 = iVar1 + iVar49;
    iVar25 = iVar49 + -1;
    iVar26 = iVar49 + -1 + iVar15;
    iVar27 = iVar1 + iVar16;
    iVar28 = iVar16 + -1;
    iVar29 = iVar16 + -1 + iVar15;
    lVar46 = lVar47;
    iVar32 = -0xc;
    do {
      auVar69._0_4_ = (float)iVar32;
      auVar89 = in_ZMM8._4_12_;
      auVar69._4_12_ = auVar89;
      auVar56 = auVar92._0_16_;
      auVar53 = vfmadd213ss_fma(auVar69,auVar56,ZEXT416((uint)fVar3));
      auVar86._0_4_ = (float)(iVar32 + 1);
      auVar86._4_12_ = auVar89;
      auVar55 = vfmadd213ss_fma(auVar86,auVar56,ZEXT416((uint)fVar3));
      fVar85 = auVar55._0_4_;
      auVar77._0_4_ = (float)(iVar32 + 2);
      auVar77._4_12_ = auVar89;
      auVar55 = vfmadd213ss_fma(auVar77,auVar56,ZEXT416((uint)fVar3));
      auVar74._0_4_ = (float)(iVar32 + 3);
      auVar74._4_12_ = auVar89;
      auVar56 = vfmadd213ss_fma(auVar74,auVar56,ZEXT416((uint)fVar3));
      fVar67 = auVar53._0_4_;
      fVar76 = auVar55._0_4_;
      fVar72 = auVar56._0_4_;
      pfVar39 = (float *)((long)haarResponseY + lVar46);
      iVar30 = (int)((double)((ulong)(0.0 <= fVar67) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar67) * -0x4020000000000000) + (double)fVar67);
      if ((((iVar49 < 1) || (iVar30 < 1)) || (iimage->height < iVar24)) ||
         (iVar17 = iVar1 + iVar30, iimage->width < iVar17)) {
        haarXY(iimage,iVar49,iVar30,iVar15,(float *)((long)haarResponseX + lVar46),pfVar39);
      }
      else {
        iVar20 = iVar30 + -1 + iVar15;
        pfVar52 = iimage->data;
        iVar18 = iimage->data_width;
        iVar19 = iVar18 * iVar25;
        fVar67 = pfVar52[iVar18 * iVar26 + -1 + iVar30];
        iVar35 = iVar18 * (iVar1 + -1 + iVar49);
        fVar5 = pfVar52[iVar35 + -1 + iVar30];
        fVar73 = pfVar52[iVar35 + -1 + iVar17];
        fVar6 = pfVar52[iVar19 + -1 + iVar30];
        fVar7 = pfVar52[iVar19 + -1 + iVar17];
        fVar8 = pfVar52[iVar18 * iVar26 + -1 + iVar17];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar19 + iVar20] - pfVar52[iVar35 + iVar20]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar6)));
        *(float *)((long)haarResponseX + lVar46) = (fVar5 - fVar7) + auVar53._0_4_;
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar6)));
        *pfVar39 = auVar53._0_4_ - (fVar5 - fVar7);
      }
      iVar17 = (int)((double)((ulong)(0.0 <= fVar85) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar85) * -0x4020000000000000) + (double)fVar85);
      pfVar39 = (float *)((long)haarResponseX + lVar46 + 4);
      pfVar52 = (float *)((long)haarResponseY + lVar46 + 4);
      if (((iVar49 < 1) || (iVar17 < 1)) ||
         ((iimage->height < iVar24 || (iVar18 = iVar1 + iVar17, iimage->width < iVar18)))) {
        haarXY(iimage,iVar49,iVar17,iVar15,pfVar39,pfVar52);
      }
      else {
        iVar35 = iVar17 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar19 = iimage->data_width;
        iVar20 = iVar19 * iVar25;
        fVar67 = pfVar37[iVar19 * iVar26 + -1 + iVar17];
        iVar44 = iVar19 * (iVar1 + -1 + iVar49);
        fVar85 = pfVar37[iVar44 + -1 + iVar17];
        fVar5 = pfVar37[iVar44 + -1 + iVar18];
        fVar73 = pfVar37[iVar20 + -1 + iVar17];
        fVar6 = pfVar37[iVar20 + -1 + iVar18];
        fVar7 = pfVar37[iVar19 * iVar26 + -1 + iVar18];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar20 + iVar35] - pfVar37[iVar44 + iVar35]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar73)));
        *pfVar39 = (fVar85 - fVar6) + auVar53._0_4_;
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar73)));
        *pfVar52 = auVar53._0_4_ - (fVar85 - fVar6);
      }
      iVar18 = (int)((double)((ulong)(0.0 <= fVar76) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar76) * -0x4020000000000000) + (double)fVar76);
      pfVar39 = (float *)((long)haarResponseX + lVar46 + 8);
      pfVar52 = (float *)((long)haarResponseY + lVar46 + 8);
      if (((iVar49 < 1) || (iVar18 < 1)) ||
         ((iimage->height < iVar24 || (iVar19 = iVar1 + iVar18, iimage->width < iVar19)))) {
        haarXY(iimage,iVar49,iVar18,iVar15,pfVar39,pfVar52);
      }
      else {
        iVar44 = iVar18 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar20 = iimage->data_width;
        iVar35 = iVar20 * iVar25;
        fVar67 = pfVar37[iVar20 * iVar26 + -1 + iVar18];
        iVar43 = iVar20 * (iVar1 + -1 + iVar49);
        fVar76 = pfVar37[iVar43 + -1 + iVar18];
        fVar85 = pfVar37[iVar43 + -1 + iVar19];
        fVar5 = pfVar37[iVar35 + -1 + iVar18];
        fVar73 = pfVar37[iVar35 + -1 + iVar19];
        fVar6 = pfVar37[iVar20 * iVar26 + -1 + iVar19];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar35 + iVar44] - pfVar37[iVar43 + iVar44]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar85 - fVar5)));
        *pfVar39 = (fVar76 - fVar73) + auVar53._0_4_;
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar85 - fVar5)));
        *pfVar52 = auVar53._0_4_ - (fVar76 - fVar73);
      }
      iVar19 = (int)((double)((ulong)(0.0 <= fVar72) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar72) * -0x4020000000000000) + (double)fVar72);
      pfVar39 = (float *)((long)haarResponseX + lVar46 + 0xc);
      pfVar52 = (float *)((long)haarResponseY + lVar46 + 0xc);
      if ((((iVar49 < 1) || (iVar19 < 1)) || (iimage->height < iVar24)) ||
         (iVar20 = iVar1 + iVar19, iimage->width < iVar20)) {
        haarXY(iimage,iVar49,iVar19,iVar15,pfVar39,pfVar52);
      }
      else {
        iVar43 = iVar19 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar35 = iimage->data_width;
        iVar44 = iVar35 * iVar25;
        fVar67 = pfVar37[iVar35 * iVar26 + -1 + iVar19];
        iVar42 = iVar35 * (iVar1 + -1 + iVar49);
        fVar72 = pfVar37[iVar42 + -1 + iVar19];
        fVar76 = pfVar37[iVar42 + -1 + iVar20];
        fVar85 = pfVar37[iVar44 + -1 + iVar19];
        fVar5 = pfVar37[iVar44 + -1 + iVar20];
        fVar73 = pfVar37[iVar35 * iVar26 + -1 + iVar20];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar44 + iVar43] - pfVar37[iVar42 + iVar43]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar76 - fVar85)));
        *pfVar39 = (fVar72 - fVar5) + auVar53._0_4_;
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar76 - fVar85)));
        *pfVar52 = auVar53._0_4_ - (fVar72 - fVar5);
      }
      pfVar39 = (float *)((long)haarResponseX + lVar46 + 0x60);
      pfVar52 = (float *)((long)haarResponseY + lVar46 + 0x60);
      if (((iVar16 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar27 || (iVar20 = iVar1 + iVar30, iimage->width < iVar20)))) {
        haarXY(iimage,iVar16,iVar30,iVar15,pfVar39,pfVar52);
      }
      else {
        iVar42 = iVar30 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar35 = iimage->data_width;
        iVar43 = iVar35 * iVar28;
        fVar67 = pfVar37[iVar35 * iVar29 + -1 + iVar30];
        iVar44 = iVar35 * (iVar1 + -1 + iVar16);
        fVar72 = pfVar37[iVar44 + -1 + iVar30];
        fVar76 = pfVar37[iVar44 + -1 + iVar20];
        fVar85 = pfVar37[iVar43 + -1 + iVar30];
        fVar5 = pfVar37[iVar43 + -1 + iVar20];
        fVar73 = pfVar37[iVar35 * iVar29 + -1 + iVar20];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar43 + iVar42] - pfVar37[iVar44 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar76 - fVar85)));
        *pfVar39 = (fVar72 - fVar5) + auVar53._0_4_;
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar76 - fVar85)));
        *pfVar52 = auVar53._0_4_ - (fVar72 - fVar5);
      }
      pfVar39 = (float *)((long)haarResponseX + lVar46 + 100);
      pfVar52 = (float *)((long)haarResponseY + lVar46 + 100);
      if (((iVar16 < 1) || (iVar17 < 1)) ||
         ((iimage->height < iVar27 || (iVar30 = iVar1 + iVar17, iimage->width < iVar30)))) {
        haarXY(iimage,iVar16,iVar17,iVar15,pfVar39,pfVar52);
      }
      else {
        iVar43 = iVar17 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar20 = iimage->data_width;
        iVar44 = iVar20 * iVar28;
        fVar67 = pfVar37[iVar20 * iVar29 + -1 + iVar17];
        iVar35 = iVar20 * (iVar1 + -1 + iVar16);
        fVar72 = pfVar37[iVar35 + -1 + iVar17];
        fVar76 = pfVar37[iVar35 + -1 + iVar30];
        fVar85 = pfVar37[iVar44 + -1 + iVar17];
        fVar5 = pfVar37[iVar44 + -1 + iVar30];
        fVar73 = pfVar37[iVar20 * iVar29 + -1 + iVar30];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar44 + iVar43] - pfVar37[iVar35 + iVar43]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar76 - fVar85)));
        *pfVar39 = (fVar72 - fVar5) + auVar53._0_4_;
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar76 - fVar85)));
        *pfVar52 = auVar53._0_4_ - (fVar72 - fVar5);
      }
      pfVar39 = (float *)((long)haarResponseX + lVar46 + 0x68);
      pfVar52 = (float *)((long)haarResponseY + lVar46 + 0x68);
      if ((((iVar16 < 1) || (iVar18 < 1)) || (iimage->height < iVar27)) ||
         (iVar30 = iVar1 + iVar18, iimage->width < iVar30)) {
        haarXY(iimage,iVar16,iVar18,iVar15,pfVar39,pfVar52);
      }
      else {
        iVar44 = iVar18 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar17 = iimage->data_width;
        iVar35 = iVar17 * iVar28;
        fVar67 = pfVar37[iVar17 * iVar29 + -1 + iVar18];
        iVar20 = iVar17 * (iVar1 + -1 + iVar16);
        fVar72 = pfVar37[iVar20 + -1 + iVar18];
        fVar76 = pfVar37[iVar20 + -1 + iVar30];
        fVar85 = pfVar37[iVar35 + -1 + iVar18];
        fVar5 = pfVar37[iVar35 + -1 + iVar30];
        fVar73 = pfVar37[iVar17 * iVar29 + -1 + iVar30];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar35 + iVar44] - pfVar37[iVar20 + iVar44]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar76 - fVar85)));
        *pfVar39 = (fVar72 - fVar5) + auVar53._0_4_;
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar76 - fVar85)));
        *pfVar52 = auVar53._0_4_ - (fVar72 - fVar5);
      }
      pfVar39 = (float *)((long)haarResponseX + lVar46 + 0x6c);
      pfVar52 = (float *)((long)haarResponseY + lVar46 + 0x6c);
      if (((iVar16 < 1) || (iVar19 < 1)) ||
         ((iimage->height < iVar27 || (iVar30 = iVar1 + iVar19, iimage->width < iVar30)))) {
        haarXY(iimage,iVar16,iVar19,iVar15,pfVar39,pfVar52);
      }
      else {
        iVar18 = iVar19 + -1 + iVar15;
        pfVar37 = iimage->data;
        iVar17 = iimage->data_width;
        iVar35 = iVar17 * iVar28;
        fVar67 = pfVar37[iVar17 * iVar29 + -1 + iVar19];
        iVar20 = iVar17 * (iVar1 + -1 + iVar16);
        fVar72 = pfVar37[iVar20 + -1 + iVar19];
        fVar76 = pfVar37[iVar20 + -1 + iVar30];
        fVar85 = pfVar37[iVar35 + -1 + iVar19];
        fVar5 = pfVar37[iVar35 + -1 + iVar30];
        fVar73 = pfVar37[iVar17 * iVar29 + -1 + iVar30];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar35 + iVar18] - pfVar37[iVar20 + iVar18]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar76 - fVar85)));
        *pfVar39 = (fVar72 - fVar5) + auVar53._0_4_;
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar67 - fVar73)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar76 - fVar85)));
        *pfVar52 = auVar53._0_4_ - (fVar72 - fVar5);
      }
      auVar92 = ZEXT1664(auVar54);
      lVar46 = lVar46 + 0x10;
      bVar2 = iVar32 < 8;
      iVar32 = iVar32 + 4;
    } while (bVar2);
    lVar47 = lVar47 + 0xc0;
    bVar2 = (int)uVar21 < 10;
    uVar21 = uVar21 + 2;
  } while (bVar2);
LAB_001c04a0:
  fVar67 = auVar92._0_4_;
  auVar91._8_4_ = 0x3effffff;
  auVar91._0_8_ = 0x3effffff3effffff;
  auVar91._12_4_ = 0x3effffff;
  auVar90._8_4_ = 0x80000000;
  auVar90._0_8_ = 0x8000000080000000;
  auVar90._12_4_ = 0x80000000;
  auVar53 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 0.5)),auVar90,0xf8);
  auVar53 = ZEXT416((uint)(fVar67 * 0.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 1.5)),auVar90,0xf8);
  auVar54 = ZEXT416((uint)(fVar67 * 1.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 2.5)),auVar90,0xf8);
  auVar55 = ZEXT416((uint)(fVar67 * 2.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 3.5)),auVar90,0xf8);
  auVar56 = ZEXT416((uint)(fVar67 * 3.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 4.5)),auVar90,0xf8);
  auVar57 = ZEXT416((uint)(fVar67 * 4.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 5.5)),auVar90,0xf8);
  auVar58 = ZEXT416((uint)(fVar67 * 5.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 6.5)),auVar90,0xf8);
  auVar59 = ZEXT416((uint)(fVar67 * 6.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 7.5)),auVar90,0xf8);
  auVar60 = ZEXT416((uint)(auVar60._0_4_ + fVar67 * 7.5));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 8.5)),auVar90,0xf8);
  auVar61 = ZEXT416((uint)(fVar67 * 8.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 9.5)),auVar90,0xf8);
  auVar62 = ZEXT416((uint)(fVar67 * 9.5 + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar63 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 10.5)),auVar90,0xf8);
  auVar63 = ZEXT416((uint)(fVar67 * 10.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar67 * 11.5)),auVar90,0xf8);
  auVar64 = ZEXT416((uint)(fVar67 * 11.5 + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  fVar73 = auVar55._0_4_;
  fVar67 = fVar73 + auVar54._0_4_;
  fVar3 = fVar73 + auVar53._0_4_;
  fVar4 = fVar73 - auVar53._0_4_;
  fVar72 = fVar73 - auVar54._0_4_;
  fVar76 = fVar73 - auVar56._0_4_;
  fVar85 = fVar73 - auVar57._0_4_;
  fVar5 = fVar73 - auVar58._0_4_;
  fVar73 = fVar73 - auVar59._0_4_;
  fVar87 = auVar60._0_4_;
  fVar6 = fVar87 - auVar56._0_4_;
  fVar7 = fVar87 - auVar57._0_4_;
  fVar8 = fVar87 - auVar58._0_4_;
  fVar9 = fVar87 - auVar59._0_4_;
  fVar10 = fVar87 - auVar61._0_4_;
  fVar11 = fVar87 - auVar62._0_4_;
  fVar12 = fVar87 - auVar63._0_4_;
  fVar87 = fVar87 - auVar64._0_4_;
  gauss_s1_c0[0] = expf(fVar67 * fVar67 * fVar66);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar66);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar66);
  gauss_s1_c0[3] = expf(fVar72 * fVar72 * fVar66);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar76 * fVar76 * fVar66);
  gauss_s1_c0[6] = expf(fVar85 * fVar85 * fVar66);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar66);
  gauss_s1_c0[8] = expf(fVar73 * fVar73 * fVar66);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar66);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar66);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar66);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar66);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar66);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar66);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar66);
  gauss_s1_c1[8] = expf(fVar87 * fVar87 * fVar66);
  uVar22 = 0xfffffff8;
  lVar47 = 0;
  fVar67 = 0.0;
  auVar71._8_4_ = 0x7fffffff;
  auVar71._0_8_ = 0x7fffffff7fffffff;
  auVar71._12_4_ = 0x7fffffff;
  lVar46 = 0;
  lVar40 = 0;
  do {
    pfVar39 = gauss_s1_c1;
    uVar21 = (uint)uVar22;
    if (uVar21 != 7) {
      pfVar39 = gauss_s1_c0;
    }
    if (uVar21 == 0xfffffff8) {
      pfVar39 = gauss_s1_c1;
    }
    lVar46 = (long)(int)lVar46;
    iVar15 = (int)lVar40;
    lVar40 = (long)iVar15;
    lVar38 = (long)haarResponseX + lVar47;
    lVar33 = (long)haarResponseY + lVar47;
    uVar36 = 0xfffffff8;
    uVar34 = 0;
    do {
      pfVar52 = gauss_s1_c1;
      if (uVar36 != 7) {
        pfVar52 = gauss_s1_c0;
      }
      if (uVar36 == 0xfffffff8) {
        pfVar52 = gauss_s1_c1;
      }
      uVar23 = (ulong)(uVar36 >> 0x1c & 0xfffffff8);
      auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar31 = uVar34;
      lVar45 = lVar38;
      lVar48 = lVar33;
      do {
        lVar41 = 0;
        pfVar37 = (float *)((long)pfVar39 + (ulong)(uint)((int)(uVar22 >> 0x1f) << 5));
        do {
          fVar3 = pfVar52[uVar23] * *pfVar37;
          auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar48 + lVar41 * 4)),
                                  ZEXT416(*(uint *)(lVar45 + lVar41 * 4)),0x10);
          auVar84._0_4_ = fVar3 * auVar53._0_4_;
          auVar84._4_4_ = fVar3 * auVar53._4_4_;
          auVar84._8_4_ = fVar3 * auVar53._8_4_;
          auVar84._12_4_ = fVar3 * auVar53._12_4_;
          auVar53 = vandps_avx(auVar84,auVar71);
          auVar53 = vmovlhps_avx(auVar84,auVar53);
          auVar75._0_4_ = auVar92._0_4_ + auVar53._0_4_;
          auVar75._4_4_ = auVar92._4_4_ + auVar53._4_4_;
          auVar75._8_4_ = auVar92._8_4_ + auVar53._8_4_;
          auVar75._12_4_ = auVar92._12_4_ + auVar53._12_4_;
          auVar92 = ZEXT1664(auVar75);
          pfVar37 = pfVar37 + (ulong)(~uVar21 >> 0x1f) * 2 + -1;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 9);
        uVar31 = uVar31 + 0x18;
        uVar23 = uVar23 + (ulong)(-1 < (int)uVar36) * 2 + -1;
        lVar45 = lVar45 + 0x60;
        lVar48 = lVar48 + 0x60;
      } while (uVar31 < uVar36 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar40];
      auVar14._4_4_ = fVar3;
      auVar14._0_4_ = fVar3;
      auVar14._8_4_ = fVar3;
      auVar14._12_4_ = fVar3;
      auVar55 = vmulps_avx512vl(auVar75,auVar14);
      lVar40 = lVar40 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar46) = auVar55;
      auVar78._0_4_ = auVar55._0_4_ * auVar55._0_4_;
      auVar78._4_4_ = auVar55._4_4_ * auVar55._4_4_;
      auVar78._8_4_ = auVar55._8_4_ * auVar55._8_4_;
      auVar78._12_4_ = auVar55._12_4_ * auVar55._12_4_;
      auVar53 = vmovshdup_avx(auVar78);
      auVar54 = vfmadd231ss_fma(auVar53,auVar55,auVar55);
      auVar53 = vshufpd_avx(auVar55,auVar55,1);
      auVar54 = vfmadd213ss_fma(auVar53,auVar53,auVar54);
      auVar53 = vshufps_avx(auVar55,auVar55,0xff);
      auVar53 = vfmadd213ss_fma(auVar53,auVar53,auVar54);
      fVar67 = fVar67 + auVar53._0_4_;
      lVar46 = lVar46 + 4;
      uVar36 = uVar36 + 5;
      uVar34 = uVar34 + 0x78;
      lVar38 = lVar38 + 0x1e0;
      lVar33 = lVar33 + 0x1e0;
    } while (iVar15 + 4 != (int)lVar40);
    lVar47 = lVar47 + 0x14;
    uVar22 = (ulong)(uVar21 + 5);
  } while ((int)uVar21 < 3);
  if (fVar67 < 0.0) {
    fVar67 = sqrtf(fVar67);
  }
  else {
    auVar53 = vsqrtss_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
    fVar67 = auVar53._0_4_;
  }
  auVar92 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar67)));
  lVar47 = 0;
  do {
    auVar65 = vmulps_avx512f(auVar92,*(undefined1 (*) [64])(ipoint->descriptor + lVar47));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar47) = auVar65;
    lVar47 = lVar47 + 0x10;
  } while (lVar47 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_4_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}